

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

bool __thiscall
lunasvg::SVGEnumeration<lunasvg::LengthAdjust>::parseEnum<2u>
          (SVGEnumeration<lunasvg::LengthAdjust> *this,string_view input,
          SVGEnumerationEntry<lunasvg::LengthAdjust> (*entries) [2])

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  long lVar1;
  bool bVar2;
  long lVar3;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view input_local;
  
  input_local._M_str = input._M_str;
  input_local._M_len = input._M_len;
  stripLeadingAndTrailingSpaces(&input_local);
  lVar1 = 0x10;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0x40) goto LAB_0011d095;
    __x._M_str = input_local._M_str;
    __x._M_len = input_local._M_len;
    __y._M_str = *(char **)(&(*entries)[0].first + lVar3);
    __y._M_len = *(size_t *)((long)&entries[-1][1].second._M_str + lVar3);
    bVar2 = std::operator==(__x,__y);
    lVar1 = lVar3 + 0x18;
  } while (!bVar2);
  (this->super_SVGProperty).field_0x9 = *(undefined1 *)((long)&entries[-1][1].second._M_len + lVar3)
  ;
LAB_0011d095:
  return lVar3 != 0x40;
}

Assistant:

bool SVGEnumeration<Enum>::parseEnum(std::string_view input, const SVGEnumerationEntry<Enum>(&entries)[N])
{
    stripLeadingAndTrailingSpaces(input);
    for(const auto& entry : entries) {
        if(input == entry.second) {
            m_value = entry.first;
            return true;
        }
    }

    return false;
}